

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O1

void opj_tls_destroy(opj_tls_t *tls)

{
  code *pcVar1;
  long lVar2;
  long lVar3;
  
  if (tls != (opj_tls_t *)0x0) {
    if (0 < tls->key_val_count) {
      lVar2 = 0x10;
      lVar3 = 0;
      do {
        pcVar1 = *(code **)((long)&tls->key_val->key + lVar2);
        if (pcVar1 != (code *)0x0) {
          (*pcVar1)(*(undefined8 *)((long)tls->key_val + lVar2 + -8));
        }
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0x18;
      } while (lVar3 < tls->key_val_count);
    }
    opj_free(tls->key_val);
    opj_free(tls);
    return;
  }
  return;
}

Assistant:

static void opj_tls_destroy(opj_tls_t* tls)
{
    int i;
    if (!tls) {
        return;
    }
    for (i = 0; i < tls->key_val_count; i++) {
        if (tls->key_val[i].opj_free_func) {
            tls->key_val[i].opj_free_func(tls->key_val[i].value);
        }
    }
    opj_free(tls->key_val);
    opj_free(tls);
}